

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O3

void Gia_ManProfileStructuresInt(Gia_Man_t *p,int nLimit,int fVerbose)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  Vec_Int_t *vArray;
  int *piVar4;
  Vec_Int_t *vCode;
  Vec_Int_t *p_00;
  Vec_Int_t *__ptr;
  void *__s;
  int *__ptr_00;
  int iVar5;
  Gia_Obj_t *pGVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  char *pcVar12;
  int iVar13;
  uint uVar14;
  size_t __n;
  uint uVar15;
  ulong uVar16;
  uint *local_40;
  
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMuxes.c"
                  ,0x314,"void Gia_ManProfileStructuresInt(Gia_Man_t *, int, int)");
  }
  Gia_ManStaticFanoutStart(p);
  vArray = (Vec_Int_t *)malloc(0x10);
  vArray->nCap = 100;
  vArray->nSize = 0;
  piVar4 = (int *)malloc(400);
  vArray->pArray = piVar4;
  iVar3 = p->nObjs;
  vCode = (Vec_Int_t *)malloc(0x10);
  iVar5 = iVar3 * 5;
  if (iVar3 * 5 - 1U < 0xf) {
    iVar5 = 0x10;
  }
  vCode->nSize = 0;
  vCode->nCap = iVar5;
  if (iVar5 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar5 << 2);
  }
  vCode->pArray = piVar4;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar5 = iVar3;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar5;
  iVar13 = 0;
  if (iVar5 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar5 << 2);
  }
  p_00->pArray = piVar4;
  if (0 < iVar3) {
    pGVar6 = p->pObjs;
    if (pGVar6 != (Gia_Obj_t *)0x0) {
      lVar7 = 0;
      do {
        Vec_IntPush(p_00,vCode->nSize);
        uVar16 = *(ulong *)pGVar6;
        iVar3 = (int)uVar16;
        if (((uVar16 & 0x1fffffff) == 0x1fffffff || -1 < iVar3) ||
           ((int)((uint)(uVar16 >> 0x20) & 0x1fffffff) < p->vCos->nSize - p->nRegs)) {
          pGVar2 = p->pObjs;
          if ((pGVar6 < pGVar2) || (pGVar2 + p->nObjs <= pGVar6)) {
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          if ((p->pMuxes == (uint *)0x0) ||
             (uVar9 = 3,
             p->pMuxes[(int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555] == 0)) {
            iVar5 = (int)(uVar16 & 0x1fffffff);
            uVar9 = 2;
            if (iVar3 < 0 || iVar5 == 0x1fffffff) {
              uVar9 = (ulong)(iVar3 < 0 && iVar5 != 0x1fffffff);
            }
          }
          iVar3 = (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555;
          if ((-1 < iVar3) && (iVar3 < p->vFanoutNums->nSize)) {
            iVar3 = Gia_ManEncodeObj(p,(int)lVar7);
            Vec_IntPush(vCode,iVar3);
            (*(code *)(&DAT_0098f9e0 + *(int *)(&DAT_0098f9e0 + uVar9 * 4)))();
            return;
          }
          goto LAB_00731a28;
        }
        lVar7 = lVar7 + 1;
        iVar3 = p->nObjs;
      } while ((lVar7 < iVar3) && (pGVar6 = p->pObjs + lVar7, p->pObjs != (Gia_Obj_t *)0x0));
    }
    iVar13 = p_00->nSize;
  }
  if (iVar13 != iVar3) {
    __assert_fail("Vec_IntSize(vCodeOffsets) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMuxes.c"
                  ,0x348,"void Gia_ManProfileStructuresInt(Gia_Man_t *, int, int)");
  }
  Vec_IntPush(p_00,vCode->nSize);
  if (fVerbose != 0) {
    pcVar12 = "Showing TFI/node/TFO structures for all nodes:";
    puts("Showing TFI/node/TFO structures for all nodes:");
    if (0 < p->nObjs) {
      iVar3 = 0;
      do {
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        Gia_ManProfileCollect((Gia_Man_t *)pcVar12,iVar3,vCode,p_00,vArray);
        pcVar12 = (char *)p;
        Gia_ManProfilePrintOne(p,iVar3,vArray);
        iVar3 = iVar3 + 1;
      } while (iVar3 < p->nObjs);
    }
  }
  __ptr = Gia_ManProfileHash(p,vCode,p_00);
  uVar1 = __ptr->nSize;
  uVar16 = (ulong)uVar1;
  if (uVar16 == 0) {
    local_40 = (uint *)malloc(0x10);
    uVar15 = 0;
    uVar14 = 1;
LAB_007316f6:
    *local_40 = 0x10;
    uVar8 = 0x10;
LAB_00731709:
    piVar4 = (int *)malloc((long)(int)uVar8 << 2);
    *(int **)(local_40 + 2) = piVar4;
    local_40[1] = uVar14;
    __n = (long)(int)uVar14 << 2;
    memset(piVar4,0,__n);
    __s = malloc((long)(int)uVar8 << 2);
  }
  else {
    uVar15 = *__ptr->pArray;
    if (1 < (int)uVar1) {
      uVar9 = 1;
      do {
        uVar14 = __ptr->pArray[uVar9];
        if ((int)uVar15 <= (int)uVar14) {
          uVar15 = uVar14;
        }
        uVar9 = uVar9 + 1;
      } while (uVar16 != uVar9);
    }
    uVar14 = uVar15 + 1;
    local_40 = (uint *)malloc(0x10);
    if (uVar15 < 0xf) goto LAB_007316f6;
    *local_40 = uVar14;
    uVar8 = uVar14;
    if (uVar14 != 0) goto LAB_00731709;
    local_40[2] = 0;
    local_40[3] = 0;
    local_40[1] = 0;
    uVar15 = 0xffffffff;
    __n = 0;
    piVar4 = (int *)0x0;
    uVar14 = 0;
    __s = (void *)0x0;
  }
  memset(__s,0,__n);
  uVar8 = p->nObjs;
  if ((0 < (int)uVar8) && (pGVar6 = p->pObjs, pGVar6 != (Gia_Obj_t *)0x0)) {
    uVar9 = 0;
    if ((int)uVar1 < 1) {
      uVar16 = uVar9;
    }
    do {
      if (uVar16 == uVar9) goto LAB_00731a28;
      uVar1 = __ptr->pArray[uVar9];
      uVar10 = (ulong)uVar1;
      uVar11 = (uint)*(undefined8 *)pGVar6;
      if (((~uVar11 & 0x1fffffff) == 0 || -1 < (int)uVar11) ||
         ((int)((uint)((ulong)*(undefined8 *)pGVar6 >> 0x20) & 0x1fffffff) <
          p->vCos->nSize - p->nRegs)) {
        if (((int)uVar1 < 0) || ((int)uVar14 <= (int)uVar1)) goto LAB_00731a28;
        iVar3 = piVar4[uVar10];
        if (iVar3 == 0) {
          *(int *)((long)__s + uVar10 * 4) = (int)uVar9;
        }
        piVar4[uVar10] = iVar3 + -1;
      }
      uVar9 = uVar9 + 1;
      pGVar6 = pGVar6 + 1;
    } while (uVar8 != uVar9);
  }
  __ptr_00 = Abc_MergeSortCost(piVar4,uVar14);
  printf("Showing TFI/node/TFO structures that appear more than %d times.\n",(ulong)(uint)nLimit);
  if ((int)uVar15 < 1) {
    if (__ptr_00 == (int *)0x0) goto LAB_00731956;
  }
  else {
    uVar16 = 0;
LAB_0073183f:
    iVar3 = __ptr_00[uVar16];
    if (((long)iVar3 < 0) || ((int)uVar14 <= iVar3)) {
LAB_00731a28:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if (nLimit <= -piVar4[iVar3]) {
      printf("%6d : ",uVar16 & 0xffffffff);
      printf("%6d : ",(ulong)(uint)__ptr_00[uVar16]);
      uVar1 = __ptr_00[uVar16];
      if (((long)(int)uVar1 < 0) || (uVar14 <= uVar1)) goto LAB_00731a28;
      printf("Weight =%6d  ",(ulong)(uint)-piVar4[(int)uVar1]);
      pcVar12 = "First obj =";
      printf("First obj =");
      uVar1 = __ptr_00[uVar16];
      if (((long)(int)uVar1 < 0) || (uVar14 <= uVar1)) goto LAB_00731a28;
      Gia_ManProfileCollect
                ((Gia_Man_t *)pcVar12,*(int *)((long)__s + (long)(int)uVar1 * 4),vCode,p_00,vArray);
      uVar1 = __ptr_00[uVar16];
      if (((long)(int)uVar1 < 0) || (uVar14 <= uVar1)) goto LAB_00731a28;
      Gia_ManProfilePrintOne(p,*(int *)((long)__s + (long)(int)uVar1 * 4),vArray);
      uVar16 = uVar16 + 1;
      if (uVar15 != uVar16) goto LAB_0073183f;
    }
  }
  free(__ptr_00);
LAB_00731956:
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(local_40);
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (vArray->pArray != (int *)0x0) {
    free(vArray->pArray);
  }
  free(vArray);
  if (vCode->pArray != (int *)0x0) {
    free(vCode->pArray);
  }
  free(vCode);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  Gia_ManStaticFanoutStop(p);
  return;
}

Assistant:

void Gia_ManProfileStructuresInt( Gia_Man_t * p, int nLimit, int fVerbose )
{
    Vec_Int_t * vRes, * vCount, * vFirst;
    Vec_Int_t * vCode, * vCodeOffsets, * vArray;
    Gia_Obj_t * pObj, * pFanout;
    int i, k, nFanins, nFanouts, * pPerm, nClasses;
    assert( p->pMuxes );
    Gia_ManStaticFanoutStart( p );
    // create fanout codes
    vArray = Vec_IntAlloc( 100 );
    vCode = Vec_IntAlloc( 5 * Gia_ManObjNum(p) );
    vCodeOffsets = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
    {
        Vec_IntPush( vCodeOffsets, Vec_IntSize(vCode) );
        if ( Gia_ObjIsRi(p, pObj) )
            continue;
        nFanins = Gia_ObjFaninNum(p, pObj);
        nFanouts = Gia_ObjFanoutNum(p, pObj);
        Vec_IntPush( vCode, Gia_ManEncodeObj(p, i) );
        if ( nFanins == 3 )
        {
            int iLit = Gia_ObjFaninLit2p(p, pObj);
            Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Abc_LitRegular(iLit)) );
            if ( Abc_LitIsCompl(iLit) )
            {
                Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit0p(p, pObj)) );
                Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit1p(p, pObj)) );
            }
            else
            {
                Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit1p(p, pObj)) );
                Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit0p(p, pObj)) );
            }
        }
        else if ( nFanins == 2 )
        {
            int Code0 = Gia_ManEncodeFanin(p, Gia_ObjFaninLit0p(p, pObj));
            int Code1 = Gia_ManEncodeFanin(p, Gia_ObjFaninLit1p(p, pObj));
            Vec_IntPush( vCode, Code0 < Code1 ? Code0 : Code1 );
            Vec_IntPush( vCode, Code0 < Code1 ? Code1 : Code0 );
        }
        else if ( nFanins == 1 )
            Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit0p(p, pObj)) );
        else if ( Gia_ObjIsRo(p, pObj) )
            Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit0p(p, Gia_ObjRoToRi(p, pObj))) );

        // add fanouts
        Vec_IntClear( vArray );
        Gia_ObjForEachFanoutStatic( p, pObj, pFanout, k )
        {
            int Index = Gia_ObjWhatFanin( p, pFanout, pObj );
            Gia_ObjType_t Type = Gia_ManEncodeFanout( p, pFanout, Index );
            Vec_IntPush( vArray, Type );
        }
        Vec_IntSort( vArray, 0 );
        Vec_IntAppend( vCode, vArray );
    }
    assert( Vec_IntSize(vCodeOffsets) == Gia_ManObjNum(p) );
    Vec_IntPush( vCodeOffsets, Vec_IntSize(vCode) );
    // print the results
    if ( fVerbose )
    {
        printf( "Showing TFI/node/TFO structures for all nodes:\n" );
        Gia_ManForEachObj( p, pObj, i )
        {
            Gia_ManProfileCollect( p, i, vCode, vCodeOffsets, vArray );
            Gia_ManProfilePrintOne( p, i, vArray );
        }
    }

    // collect statistics
    vRes = Gia_ManProfileHash( p, vCode, vCodeOffsets );
    //Vec_IntPrint( vRes );

    // count how many times each class appears
    nClasses = Vec_IntFindMax(vRes) + 1;
    vCount = Vec_IntStart( nClasses );
    vFirst = Vec_IntStart( nClasses );
    Gia_ManForEachObj( p, pObj, i )
    {
        int Entry = Vec_IntEntry( vRes, i );
        if ( Gia_ObjIsRi(p, pObj) )
            continue;
        if ( Vec_IntEntry(vCount, Entry) == 0 )
            Vec_IntWriteEntry( vFirst, Entry, i );
        Vec_IntAddToEntry( vCount, Entry, -1 );
    }
    // sort the counts
    pPerm = Abc_MergeSortCost( Vec_IntArray(vCount), Vec_IntSize(vCount) );
    printf( "Showing TFI/node/TFO structures that appear more than %d times.\n", nLimit );
    for ( i = 0; i < nClasses-1; i++ )
    {
        if ( nLimit > -Vec_IntEntry(vCount, pPerm[i]) )
            break;
        printf( "%6d : ", i );
        printf( "%6d : ", pPerm[i] );
        printf( "Weight =%6d  ",   -Vec_IntEntry(vCount, pPerm[i]) );
        printf( "First obj =" );
        // print the object
        Gia_ManProfileCollect( p, Vec_IntEntry(vFirst, pPerm[i]), vCode, vCodeOffsets, vArray );
        Gia_ManProfilePrintOne( p, Vec_IntEntry(vFirst, pPerm[i]), vArray );
    }

    // cleanup
    ABC_FREE( pPerm );
    Vec_IntFree( vRes );
    Vec_IntFree( vCount );
    Vec_IntFree( vFirst );

    Vec_IntFree( vArray );
    Vec_IntFree( vCode );
    Vec_IntFree( vCodeOffsets );
    Gia_ManStaticFanoutStop( p );
}